

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ast.hpp
# Opt level: O0

void __thiscall
IfStatementAstNode::IfStatementAstNode
          (IfStatementAstNode *this,shared_ptr<ExpressionAstNode> *expression,
          shared_ptr<StatementAstNode> *ifStatement,shared_ptr<StatementAstNode> *elseStatement)

{
  shared_ptr<StatementAstNode> *elseStatement_local;
  shared_ptr<StatementAstNode> *ifStatement_local;
  shared_ptr<ExpressionAstNode> *expression_local;
  IfStatementAstNode *this_local;
  
  StatementAstNode::StatementAstNode(&this->super_StatementAstNode);
  (this->super_StatementAstNode).super_AstNode._vptr_AstNode =
       (_func_int **)&PTR__IfStatementAstNode_001a2b10;
  std::shared_ptr<ExpressionAstNode>::shared_ptr(&this->expression,expression);
  std::shared_ptr<StatementAstNode>::shared_ptr(&this->ifStatement,ifStatement);
  std::optional<std::shared_ptr<StatementAstNode>_>::
  optional<std::shared_ptr<StatementAstNode>,_true>(&this->elseStatement,elseStatement);
  return;
}

Assistant:

explicit IfStatementAstNode(
    std::shared_ptr<ExpressionAstNode>  expression,
    std::shared_ptr<StatementAstNode>  ifStatement,
    std::shared_ptr<StatementAstNode>  elseStatement
  ) noexcept
  : expression{std::move(expression)},
    ifStatement{std::move(ifStatement)},
    elseStatement{std::move(elseStatement)}
  {}